

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Int64 __thiscall Json::Value::asInt64(Value *this)

{
  bool bVar1;
  ulong uVar2;
  OStringStream oss;
  String local_1a0;
  ostringstream local_180 [376];
  
  uVar2 = (ulong)*(byte *)&this->bits_;
  switch(uVar2) {
  case 0:
    break;
  case 2:
    bVar1 = isInt64(this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,"LargestUInt out of Int64 range",0x1e);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
  case 1:
    uVar2 = (this->value_).int_;
    break;
  case 3:
    if (9.223372036854776e+18 < ABS((this->value_).real_)) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,"double out of Int64 range",0x19);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
    uVar2 = (ulong)(this->value_).real_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"Value is not convertible to Int64.",0x22);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    uVar2 = (ulong)(this->value_).bool_;
  }
  return uVar2;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}